

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrintVisitor.cpp
# Opt level: O0

void __thiscall
IRT::PrintVisitor::Visit(PrintVisitor *this,JumpConditionalStatement *jump_conditional_statement)

{
  ostream *poVar1;
  LogicOperatorType type;
  string local_88;
  string local_68;
  string local_38;
  JumpConditionalStatement *local_18;
  JumpConditionalStatement *jump_conditional_statement_local;
  PrintVisitor *this_local;
  
  local_18 = jump_conditional_statement;
  jump_conditional_statement_local = (JumpConditionalStatement *)this;
  PrintTabs(this);
  poVar1 = std::operator<<((ostream *)&this->stream_,"JumpConditionalStatement: ");
  ToString_abi_cxx11_(&local_38,(IRT *)(ulong)(uint)(int)(char)local_18->operator_type_,type);
  poVar1 = std::operator<<(poVar1,(string *)&local_38);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_38);
  PrintTabs(this);
  poVar1 = std::operator<<((ostream *)&this->stream_,"TrueLabel: ");
  Label::ToString_abi_cxx11_(&local_68,&local_18->label_true_);
  poVar1 = std::operator<<(poVar1,(string *)&local_68);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_68);
  PrintTabs(this);
  poVar1 = std::operator<<((ostream *)&this->stream_,"FalseLabel: ");
  Label::ToString_abi_cxx11_(&local_88,&local_18->label_false_);
  poVar1 = std::operator<<(poVar1,(string *)&local_88);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_88);
  this->num_tabs_ = this->num_tabs_ + 1;
  (*(local_18->left_operand_->super_BaseElement)._vptr_BaseElement[2])();
  (*(local_18->right_operand_->super_BaseElement)._vptr_BaseElement[2])
            (local_18->right_operand_,this);
  this->num_tabs_ = this->num_tabs_ + -1;
  return;
}

Assistant:

void PrintVisitor::Visit(JumpConditionalStatement *jump_conditional_statement) {
  PrintTabs();
  stream_ << "JumpConditionalStatement: " <<
    ToString(jump_conditional_statement->operator_type_)<< std::endl;
  PrintTabs();
  stream_ << "TrueLabel: " << jump_conditional_statement->label_true_.ToString() << std::endl;
  PrintTabs();
  stream_ << "FalseLabel: " << jump_conditional_statement->label_false_.ToString() << std::endl;
  ++num_tabs_;
  jump_conditional_statement->left_operand_->Accept(this);
  jump_conditional_statement->right_operand_->Accept(this);
  --num_tabs_;
}